

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  InternalMetadata *this_00;
  bool bVar1;
  uint uVar2;
  FileOptions *this_01;
  SourceCodeInfo *this_02;
  undefined8 *puVar3;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_004dcea8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->dependency_,&from->dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            (&this->message_type_,&from->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            (&this->enum_type_,&from->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::RepeatedPtrField
            (&this->service_,&from->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (&this->extension_,&from->extension_);
  RepeatedField<int>::RepeatedField(&this->public_dependency_,&from->public_dependency_);
  RepeatedField<int>::RepeatedField(&this->weak_dependency_,&from->weak_dependency_);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (this_00,&(from->super_Message).super_MessageLite._internal_metadata_);
  (this->name_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->package_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->package_,(ulong)(from->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3)
    ;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->syntax_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 4) != 0) {
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->syntax_,(ulong)(from->syntax_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3);
  }
  bVar1 = _internal_has_options(from);
  if (bVar1) {
    this_01 = (FileOptions *)operator_new(0xa8);
    FileOptions::FileOptions(this_01,from->options_);
  }
  else {
    this_01 = (FileOptions *)0x0;
  }
  this->options_ = this_01;
  bVar1 = _internal_has_source_code_info(from);
  if (bVar1) {
    this_02 = (SourceCodeInfo *)operator_new(0x30);
    SourceCodeInfo::SourceCodeInfo(this_02,from->source_code_info_);
  }
  else {
    this_02 = (SourceCodeInfo *)0x0;
  }
  this->source_code_info_ = this_02;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(const FileDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      dependency_(from.dependency_),
      message_type_(from.message_type_),
      enum_type_(from.enum_type_),
      service_(from.service_),
      extension_(from.extension_),
      public_dependency_(from.public_dependency_),
      weak_dependency_(from.weak_dependency_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArenaForAllocation());
  }
  package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_package()) {
    package_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_package(), 
      GetArenaForAllocation());
  }
  syntax_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    syntax_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_syntax()) {
    syntax_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_syntax(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_options()) {
    options_ = new ::PROTOBUF_NAMESPACE_ID::FileOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  if (from._internal_has_source_code_info()) {
    source_code_info_ = new ::PROTOBUF_NAMESPACE_ID::SourceCodeInfo(*from.source_code_info_);
  } else {
    source_code_info_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileDescriptorProto)
}